

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var * __thiscall cs::domain_type::get_var_no_check(domain_type *this,var_id *id)

{
  bool bVar1;
  shared_ptr<cs::domain_ref> *this_00;
  reference pvVar2;
  long in_RSI;
  key_arg<std::__cxx11::basic_string<char>_> *in_RDI;
  raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *unaff_retaddr;
  shared_ptr<cs::domain_ref> *in_stack_ffffffffffffffd8;
  shared_ptr<cs::domain_ref> *in_stack_ffffffffffffffe0;
  key_arg<std::__cxx11::basic_string<char>_> *key;
  
  key = in_RDI;
  bVar1 = std::operator!=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    this_00 = (shared_ptr<cs::domain_ref> *)
              phmap::priv::
              raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
              ::
              at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                        (unaff_retaddr,key);
    *(element_type **)(in_RSI + 8) =
         (this_00->super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::shared_ptr<cs::domain_ref>::operator=(this_00,in_stack_ffffffffffffffd8);
  }
  pvVar2 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                     ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)(in_RDI + 8),
                      *(size_type *)(in_RSI + 8));
  return pvVar2;
}

Assistant:

var &get_var_no_check(const var_id &id) noexcept
		{
			if (id.m_ref != m_ref) {
				id.m_slot_id = m_reflect.at(id.m_id);
				id.m_ref = m_ref;
			}
			return m_slot[id.m_slot_id];
		}